

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCore.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpCoreSS::TcpCoreSS(TcpCoreSS *this)

{
  NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0> *in_RDI;
  
  NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>::NetworkCore(in_RDI);
  (in_RDI->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>).super_CommonCore.
  super_Core._vptr_Core = (_func_int **)&PTR__TcpCoreSS_009cd5f8;
  (in_RDI->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>).super_CommonCore.
  super_BrokerBase._vptr_BrokerBase = (_func_int **)&DAT_009cd9a0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4a0778);
  *(undefined1 *)
   &in_RDI[1].super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>.super_CommonCore.
    super_BrokerBase.higher_broker_id.gid = 0;
  return;
}

Assistant:

TcpCoreSS::TcpCoreSS() noexcept {}